

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_rotate_left_uint64_256(mzd_local_t *res,mzd_local_t *val,uint count)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  word tmp;
  block_t *rblock;
  block_t *block;
  uint right_count;
  uint count_local;
  mzd_local_t *val_local;
  mzd_local_t *res_local;
  
  bVar2 = (byte)count;
  bVar3 = 0x40 - bVar2;
  uVar1 = val->w64[3];
  res->w64[3] = val->w64[3] << (bVar2 & 0x3f) | val->w64[2] >> (bVar3 & 0x3f);
  res->w64[2] = val->w64[2] << (bVar2 & 0x3f) | val->w64[1] >> (bVar3 & 0x3f);
  res->w64[1] = val->w64[1] << (bVar2 & 0x3f) | val->w64[0] >> (bVar3 & 0x3f);
  res->w64[0] = val->w64[0] << (bVar2 & 0x3f) | uVar1 >> (bVar3 & 0x3f);
  return;
}

Assistant:

void mzd_rotate_left_uint64_256(mzd_local_t* res, const mzd_local_t* val, unsigned int count) {
  const unsigned int right_count = 8 * sizeof(word) - count;
  const block_t* block           = CONST_BLOCK(val, 0);
  block_t* rblock                = BLOCK(res, 0);

  const word tmp = block->w64[3] >> right_count;
  rblock->w64[3] = (block->w64[3] << count) | (block->w64[2] >> right_count);
  rblock->w64[2] = (block->w64[2] << count) | (block->w64[1] >> right_count);
  rblock->w64[1] = (block->w64[1] << count) | (block->w64[0] >> right_count);
  rblock->w64[0] = (block->w64[0] << count) | tmp;
}